

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

natwm_error client_update_hints(natwm_state *state,client *client,client_hints hints)

{
  client_state cVar1;
  theme *ptVar2;
  workspace *pwVar3;
  border_theme *pbVar4;
  uint32_t border_width;
  natwm_error nVar5;
  
  if (client == (client *)0x0) {
    nVar5 = INVALID_INPUT_ERROR;
  }
  else {
    if ((hints & FRAME_EXTENTS) != 0) {
      border_width = 0;
      if (client->is_fullscreen == false) {
        ptVar2 = state->workspace_list->theme;
        cVar1 = client->state;
        if ((cVar1 & CLIENT_URGENT) == 0) {
          if ((cVar1 & CLIENT_STICKY) == 0) {
            if ((cVar1 & CLIENT_OFF_SCREEN) == 0) {
              pbVar4 = (border_theme *)
                       ((long)&ptVar2->border_width->unfocused +
                       (ulong)((uint)client->is_focused * 2));
            }
            else {
              pbVar4 = ptVar2->border_width;
            }
          }
          else {
            pbVar4 = (border_theme *)&ptVar2->border_width->sticky;
          }
        }
        else {
          pbVar4 = (border_theme *)&ptVar2->border_width->urgent;
        }
        border_width = (uint32_t)pbVar4->unfocused;
      }
      ewmh_update_window_frame_extents(state,client->window,border_width);
    }
    nVar5 = NO_ERROR;
    if ((hints & WM_DESKTOP) != 0) {
      pwVar3 = workspace_list_find_client_workspace(state->workspace_list,client);
      if (pwVar3 == (workspace *)0x0) {
        internal_logger(natwm_logger,LEVEL_INFO,"Failed to find current desktop");
        nVar5 = RESOLUTION_FAILURE;
      }
      else {
        ewmh_update_window_desktop(state,client->window,pwVar3->index);
      }
    }
  }
  return nVar5;
}

Assistant:

enum natwm_error client_update_hints(const struct natwm_state *state, const struct client *client,
                                     enum client_hints hints)
{
        if (!client) {
                return INVALID_INPUT_ERROR;
        }

        if (hints & FRAME_EXTENTS) {
                struct theme *theme = state->workspace_list->theme;
                uint32_t border_width = client_get_active_border_width(theme, client);

                ewmh_update_window_frame_extents(state, client->window, border_width);
        }

        if (hints & WM_DESKTOP) {
                struct workspace *workspace
                        = workspace_list_find_client_workspace(state->workspace_list, client);

                if (workspace == NULL) {
                        LOG_INFO(natwm_logger, "Failed to find current desktop");

                        return RESOLUTION_FAILURE;
                }

                ewmh_update_window_desktop(state, client->window, workspace->index);
        }

        return NO_ERROR;
}